

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_float32_suite::fail_array8_float32_overflow(void)

{
  pointer buffer;
  size_type size;
  undefined4 local_54;
  size_type local_50;
  array<float,_1UL> local_44;
  undefined1 local_40 [4];
  array<float,_1UL> value;
  decoder decoder;
  value_type input [10];
  
  stack0xffffffffffffffee = 0x3f80000008ad;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[10]>
            ((decoder *)local_40,(uchar (*) [10])((long)&decoder.current.view._M_str + 6));
  memset(&local_44,0,4);
  buffer = std::array<float,_1UL>::data(&local_44);
  size = std::array<float,_1UL>::size(&local_44);
  local_50 = trial::protocol::bintoken::detail::decoder::array
                       ((decoder *)local_40,(type *)buffer,size);
  local_54 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("decoder.array(value.data(), value.size())","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd42,"void compact_float32_suite::fail_array8_float32_overflow()",&local_50,&local_54
            );
  return;
}

Assistant:

void fail_array8_float32_overflow()
{
    const value_type input[] = { token::code::array8_float32, 0x08, 0x00, 0x00, 0x80, 0x3F, 0x00, 0x00, 0x80, 0x3F };
    format::detail::decoder decoder(input);
    std::array<token::float32::type, 1> value = {};
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.array(value.data(), value.size()), 1);
}